

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Meteomatics_Internals.h
# Opt level: O0

MeteomaticsApiClient * __thiscall
MeteomaticsApiClient::createParameterListString
          (MeteomaticsApiClient *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters)

{
  size_type sVar1;
  const_reference pvVar2;
  undefined8 local_28;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parameters_local;
  string *paramString;
  
  std::__cxx11::string::string((string *)this);
  for (local_28 = 0;
      sVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(parameters), local_28 < sVar1; local_28 = local_28 + 1) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](parameters,local_28);
    std::__cxx11::string::operator+=((string *)this,(string *)pvVar2);
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(parameters);
    if (local_28 < sVar1 - 1) {
      std::__cxx11::string::operator+=((string *)this,',');
    }
  }
  return this;
}

Assistant:

std::string MeteomaticsApiClient::createParameterListString(const std::vector<std::string>& parameters)
{
    std::string paramString;
    for (std::size_t i = 0; i < parameters.size(); i++)
    {
        paramString += parameters[i];
        if (i < parameters.size()-1)
        {
            paramString += ',';
        }
    }
    return paramString;
}